

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::DelayedDestructor
          (DelayedDestructor<helics::Core> *this,
          function<void_(std::shared_ptr<helics::Core>_&)> *callFirst)

{
  long in_RDI;
  function<void_(std::shared_ptr<helics::Core>_&)> *this_00;
  TripWireDetector *this_01;
  function<void_(std::shared_ptr<helics::Core>_&)> *in_stack_ffffffffffffffb8;
  
  std::timed_mutex::timed_mutex((timed_mutex *)0x4eb0c2);
  this_00 = (function<void_(std::shared_ptr<helics::Core>_&)> *)(in_RDI + 0x28);
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
  vector((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *)
         0x4eb0d5);
  this_01 = (TripWireDetector *)(in_RDI + 0x40);
  std::function<void_(std::shared_ptr<helics::Core>_&)>::function(this_00,in_stack_ffffffffffffffb8)
  ;
  TripWireDetector::TripWireDetector(this_01);
  return;
}

Assistant:

explicit DelayedDestructor(
        std::function<void(std::shared_ptr<X>& ptr)> callFirst):
        callBeforeDeleteFunction(std::move(callFirst))
    {
    }